

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O3

bool __thiscall Js::ByteCodeWriter::DoProfileNewScArrayOp(ByteCodeWriter *this,OpCode op)

{
  FunctionBody *pFVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  undefined4 *puVar7;
  FunctionInfo *pFVar8;
  
  uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  pFVar1 = this->m_functionWrite;
  pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar8 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0081a99d;
    *puVar7 = 0;
    pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase,uVar6,pFVar8->functionId);
  if (!bVar4) {
    uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    pFVar1 = this->m_functionWrite;
    pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar8 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_0081a99d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeNewScArrayPhase,uVar6,pFVar8->functionId
                             );
    if (((!bVar4) &&
        (pUVar2 = (this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.
                  m_utf8SourceInfo.ptr, bVar5 = pUVar2->field_0xa8,
        (byte)((bVar5 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0) & (bVar5 & 0x40) >> 6)
        == 0)) && ((ushort)(op - NewScArray) < 6)) {
      bVar5 = 0x29 >> ((byte)(op - NewScArray) & 0x1f);
      goto LAB_0081a98c;
    }
  }
  bVar5 = 0;
LAB_0081a98c:
  return (bool)(bVar5 & 1);
}

Assistant:

bool DoProfileNewScArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !PHASE_OFF(NativeNewScArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScIntArray || op == OpCode::NewScFltArray || op == OpCode::NewScArray);
        }